

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.cpp
# Opt level: O0

void messages(void)

{
  void *__s;
  void *__s_00;
  char *pcVar1;
  void *__s_01;
  size_t adrsize;
  char *testcase;
  char *exp;
  size_t written;
  rtosc_print_options shortline;
  char *printed;
  size_t len;
  size_t rd;
  rtosc_arg_val_t scanned [3];
  char *input;
  char *msgbuf;
  int msgbuflen;
  char *strbuf;
  int strbuflen;
  int num;
  char *in_stack_ffffffffffffff28;
  rtosc_print_options *opt;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  rtosc_arg_val_t *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  size_t in_stack_ffffffffffffff70;
  void *bufsize;
  
  rtosc_count_printed_arg_vals_of_msg(in_stack_ffffffffffffff28);
  assert_int_eq((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30,
                in_stack_ffffffffffffff28,0);
  __s = operator_new__(0x100);
  memset(__s,0x7f,0x100);
  __s_00 = operator_new__(0x100);
  memset(__s_00,0x7f,0x100);
  rtosc_count_printed_arg_vals_of_msg(in_stack_ffffffffffffff28);
  assert_int_eq((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30,
                in_stack_ffffffffffffff28,0);
  pcVar1 = (char *)0x100;
  rtosc_scan_message((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40,
                     in_stack_ffffffffffffff38,in_stack_ffffffffffffff70);
  strlen("%this is a savefile\n/noteOn 0 0 0 % a noteOn message");
  assert_int_eq((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30,
                pcVar1,0);
  assert_str_eq(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                (int)((ulong)pcVar1 >> 0x20));
  __s_01 = operator_new__(0x80);
  memset(__s_01,0x7f,0x80);
  make_print_options((rtosc_print_options *)&stack0xffffffffffffff58,true,3," ",7,1);
  opt = (rtosc_print_options *)((ulong)pcVar1 & 0xffffffff00000000);
  adrsize = rtosc_print_message(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                                (size_t)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                                (size_t)in_stack_ffffffffffffff30,opt,in_stack_ffffffffffffff60);
  pcVar1 = "/noteOn\n    0 0\n    0";
  assert_str_eq(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                (int)((ulong)opt >> 0x20));
  strlen(pcVar1);
  assert_int_eq((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30,
                &opt->lossless,0);
  bufsize = __s_01;
  if (__s_01 != (void *)0x0) {
    operator_delete__(__s_01);
  }
  testcase = (char *)0x100;
  rtosc_scan_message((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58,adrsize,(rtosc_arg_val_t *)pcVar1,(size_t)__s_01,
                     in_stack_ffffffffffffff38,(size_t)bufsize);
  assert_int_eq((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30,
                testcase,0);
  if (__s_00 != (void *)0x0) {
    operator_delete__(__s_00);
  }
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  return;
}

Assistant:

void messages()
{

    int num = rtosc_count_printed_arg_vals_of_msg("not beginning with a '/'");
    assert_int_eq(-1, num, "return -1 if the message does not start"
                           "with a slash", __LINE__);

    int strbuflen = 256;
    char* strbuf = new char[strbuflen];
    memset(strbuf, 0x7f, strbuflen); /* init with rubbish */
    int msgbuflen = 256;
    char* msgbuf = new char[msgbuflen];
    memset(msgbuf, 0x7f, msgbuflen); /* init with rubbish */
    const char* input = "%this is a savefile\n"
                        "/noteOn 0 0 0 % a noteOn message";

    num = rtosc_count_printed_arg_vals_of_msg(input);
    assert_int_eq(3, num, "read a /noteOn message", __LINE__);
    rtosc_arg_val_t scanned[3];
    size_t rd = rtosc_scan_message(input, msgbuf, msgbuflen,
                                   scanned, num,
                                   strbuf, strbuflen);
    assert_int_eq(strlen(input), rd,
                  "read a message and return correct length", __LINE__);
    assert_str_eq("/noteOn", msgbuf, "scan address correctly", __LINE__);

    size_t len = 128;
    char* printed = new char[len];
    memset(printed, 0x7f, len); /* init with rubbish */
    auto shortline = make_print_options(true, 3, " ", 7, true);
    size_t written = rtosc_print_message("/noteOn", scanned, num,
                                         printed, len, &shortline, 0);

    const char* exp = "/noteOn\n    0 0\n    0";
    assert_str_eq(exp, printed, "print a message", __LINE__);
    assert_int_eq(strlen(exp), written,
                  "print a message and return written number of bytes",
                  __LINE__);
    delete[] printed;

    // scan message that has no parameters
    // => a following argument is not considered as an argument of
    //    the first message
    rd = rtosc_scan_message("/first_param\n"
                            "/second_param 123", msgbuf, msgbuflen,
                            scanned, 0, strbuf, strbuflen);
    assert_int_eq(13, rd, "scan message without arguments", __LINE__);
    delete[] msgbuf;
    delete[] strbuf;
}